

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O2

int __thiscall cbtQuantizedBvh::calcSplittingAxis(cbtQuantizedBvh *this,int startIndex,int endIndex)

{
  float fVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar13;
  float fVar14;
  float fVar17;
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [64];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  cbtVector3 cVar24;
  cbtVector3 cVar25;
  undefined4 local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  
  fVar20 = 0.0;
  fVar21 = 0.0;
  fVar22 = 0.0;
  fVar23 = 0.0;
  fVar9 = 0.0;
  iVar4 = startIndex;
  while( true ) {
    uVar15 = in_ZMM0._8_8_;
    if (endIndex <= iVar4) break;
    cVar24 = getAabbMax(this,iVar4);
    uVar16 = uVar15;
    cVar25 = getAabbMin(this,iVar4);
    local_68 = cVar24.m_floats[2];
    local_58 = cVar24.m_floats[0];
    uStack_54 = cVar24.m_floats[1];
    uStack_50 = (float)uVar15;
    uStack_4c = (float)((ulong)uVar15 >> 0x20);
    auVar10._0_4_ = cVar25.m_floats[0] + local_58;
    auVar10._4_4_ = cVar25.m_floats[1] + uStack_54;
    auVar10._8_4_ = (float)uVar16 + uStack_50;
    auVar10._12_4_ = (float)((ulong)uVar16 >> 0x20) + uStack_4c;
    iVar4 = iVar4 + 1;
    auVar2._8_4_ = 0x3f000000;
    auVar2._0_8_ = 0x3f0000003f000000;
    auVar2._12_4_ = 0x3f000000;
    auVar5 = vmulps_avx512vl(auVar10,auVar2);
    in_ZMM0 = ZEXT1664(auVar5);
    fVar20 = fVar20 + auVar5._0_4_;
    fVar21 = fVar21 + auVar5._4_4_;
    fVar22 = fVar22 + auVar5._8_4_;
    fVar23 = fVar23 + auVar5._12_4_;
    fVar9 = fVar9 + (cVar25.m_floats[2] + local_68) * 0.5;
  }
  iVar4 = endIndex - startIndex;
  fVar7 = 1.0 / (float)iVar4;
  auVar12 = ZEXT464((uint)(fVar7 * fVar9));
  fVar19 = 0.0;
  auVar5._0_4_ = fVar7 * fVar20;
  auVar5._4_4_ = fVar7 * fVar21;
  auVar5._8_4_ = fVar7 * fVar22;
  auVar5._12_4_ = fVar7 * fVar23;
  fVar20 = 0.0;
  fVar21 = 0.0;
  fVar22 = 0.0;
  fVar23 = 0.0;
  while( true ) {
    uVar15 = auVar12._8_8_;
    if (endIndex <= startIndex) break;
    cVar24 = getAabbMax(this,startIndex);
    uVar16 = uVar15;
    cVar25 = getAabbMin(this,startIndex);
    local_68 = cVar24.m_floats[2];
    local_58 = cVar24.m_floats[0];
    uStack_54 = cVar24.m_floats[1];
    uStack_50 = (float)uVar15;
    uStack_4c = (float)((ulong)uVar15 >> 0x20);
    auVar11._0_4_ = cVar25.m_floats[0] + local_58;
    auVar11._4_4_ = cVar25.m_floats[1] + uStack_54;
    auVar11._8_4_ = (float)uVar16 + uStack_50;
    auVar11._12_4_ = (float)((ulong)uVar16 >> 0x20) + uStack_4c;
    startIndex = startIndex + 1;
    auVar6._8_4_ = 0x3f000000;
    auVar6._0_8_ = 0x3f0000003f000000;
    auVar6._12_4_ = 0x3f000000;
    auVar6 = vmulps_avx512vl(auVar11,auVar6);
    fVar1 = (cVar25.m_floats[2] + local_68) * 0.5 - fVar7 * fVar9;
    auVar6 = vsubps_avx(auVar6,auVar5);
    fVar8 = auVar6._0_4_ * auVar6._0_4_;
    fVar13 = auVar6._4_4_ * auVar6._4_4_;
    fVar14 = auVar6._8_4_ * auVar6._8_4_;
    fVar17 = auVar6._12_4_ * auVar6._12_4_;
    auVar12 = ZEXT1664(CONCAT412(fVar17,CONCAT48(fVar14,CONCAT44(fVar13,fVar8))));
    fVar20 = fVar20 + fVar8;
    fVar21 = fVar21 + fVar13;
    fVar22 = fVar22 + fVar14;
    fVar23 = fVar23 + fVar17;
    fVar19 = fVar19 + fVar1 * fVar1;
  }
  fVar9 = 1.0 / ((float)iVar4 + -1.0);
  auVar18._0_4_ = fVar9 * fVar20;
  auVar18._4_4_ = fVar9 * fVar21;
  auVar18._8_4_ = fVar9 * fVar22;
  auVar18._12_4_ = fVar9 * fVar23;
  auVar6 = vmovshdup_avx(auVar18);
  auVar5 = vmaxss_avx(auVar6,auVar18);
  uVar3 = 2;
  if (fVar9 * fVar19 <= auVar5._0_4_) {
    uVar3 = (uint)(auVar18._0_4_ < auVar6._0_4_);
  }
  return uVar3;
}

Assistant:

int cbtQuantizedBvh::calcSplittingAxis(int startIndex, int endIndex)
{
	int i;

	cbtVector3 means(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
	cbtVector3 variance(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
	int numIndices = endIndex - startIndex;

	for (i = startIndex; i < endIndex; i++)
	{
		cbtVector3 center = cbtScalar(0.5) * (getAabbMax(i) + getAabbMin(i));
		means += center;
	}
	means *= (cbtScalar(1.) / (cbtScalar)numIndices);

	for (i = startIndex; i < endIndex; i++)
	{
		cbtVector3 center = cbtScalar(0.5) * (getAabbMax(i) + getAabbMin(i));
		cbtVector3 diff2 = center - means;
		diff2 = diff2 * diff2;
		variance += diff2;
	}
	variance *= (cbtScalar(1.) / ((cbtScalar)numIndices - 1));

	return variance.maxAxis();
}